

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_8.c
# Opt level: O3

parasail_result_t *
parasail_sw_rowcol_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  longlong *plVar1;
  __m256i alVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  long lVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  __m256i *palVar23;
  __m256i c;
  longlong lVar24;
  longlong lVar25;
  uint uVar26;
  int iVar27;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar28;
  __m256i *b_00;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  uint a;
  int iVar46;
  ulong uVar47;
  uint uVar48;
  __m256i *ptr;
  long lVar49;
  ulong uVar50;
  long lVar51;
  ulong uVar52;
  int iVar53;
  long lVar54;
  ulong size;
  int iVar55;
  bool bVar56;
  undefined1 uVar57;
  undefined1 uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  char cVar69;
  undefined1 auVar68 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined4 in_stack_fffffffffffffe68;
  char cVar74;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe84;
  ulong local_168;
  __m256i *local_160;
  ulong local_158;
  undefined1 auVar60 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_rowcol_striped_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar3 = (profile->profile8).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_rowcol_striped_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_rowcol_striped_profile_avx2_256_8_cold_6();
      }
      else {
        uVar48 = profile->s1Len;
        if ((int)uVar48 < 1) {
          parasail_sw_rowcol_striped_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_rowcol_striped_profile_avx2_256_8_cold_4();
        }
        else {
          local_158 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_rowcol_striped_profile_avx2_256_8_cold_3();
          }
          else if (open < 0) {
            parasail_sw_rowcol_striped_profile_avx2_256_8_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_rowcol_striped_profile_avx2_256_8_cold_1();
          }
          else {
            uVar47 = (ulong)uVar48 + 0x1f;
            size = uVar47 >> 5;
            uVar48 = uVar48 - 1;
            uVar29 = (ulong)uVar48;
            uVar26 = (uint)(uVar29 / size);
            iVar27 = ppVar4->max;
            a = (uint)uVar47 & 0x7fffffe0;
            result = parasail_result_new_rowcol1(a,s2Len);
            if (result != (parasail_result_t *)0x0) {
              result->flag = result->flag | 0x20140804;
              b = parasail_memalign___m256i(0x20,size);
              palVar28 = parasail_memalign___m256i(0x20,size);
              local_160 = parasail_memalign___m256i(0x20,size);
              b_00 = parasail_memalign___m256i(0x20,size);
              if ((b_00 != (__m256i *)0x0 && local_160 != (__m256i *)0x0) &&
                  (palVar28 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
                local_168 = 0;
                iVar46 = 0x1f - uVar26;
                uVar57 = (undefined1)open;
                uVar58 = (undefined1)gap;
                alVar2[0]._4_4_ = in_stack_fffffffffffffe6c;
                alVar2[0]._0_4_ = in_stack_fffffffffffffe68;
                alVar2[1]._0_4_ = iVar27;
                alVar2[1]._4_4_ = in_stack_fffffffffffffe74;
                alVar2[2]._0_4_ = in_stack_fffffffffffffe78;
                alVar2[2]._4_4_ = uVar48;
                alVar2[3]._0_4_ = uVar26;
                alVar2[3]._4_4_ = in_stack_fffffffffffffe84;
                parasail_memset___m256i(b,alVar2,size);
                c[0]._4_4_ = in_stack_fffffffffffffe6c;
                c[0]._0_4_ = in_stack_fffffffffffffe68;
                c[1]._0_4_ = iVar27;
                c[1]._4_4_ = in_stack_fffffffffffffe74;
                c[2]._0_4_ = in_stack_fffffffffffffe78;
                c[2]._4_4_ = uVar48;
                c[3]._0_4_ = uVar26;
                c[3]._4_4_ = in_stack_fffffffffffffe84;
                parasail_memset___m256i(b_00,c,size);
                auVar7[1] = uVar58;
                auVar7[0] = uVar58;
                auVar7[2] = uVar58;
                auVar7[3] = uVar58;
                auVar7[4] = uVar58;
                auVar7[5] = uVar58;
                auVar7[6] = uVar58;
                auVar7[7] = uVar58;
                auVar7[8] = uVar58;
                auVar7[9] = uVar58;
                auVar7[10] = uVar58;
                auVar7[0xb] = uVar58;
                auVar7[0xc] = uVar58;
                auVar7[0xd] = uVar58;
                auVar7[0xe] = uVar58;
                auVar7[0xf] = uVar58;
                auVar7[0x10] = uVar58;
                auVar7[0x11] = uVar58;
                auVar7[0x12] = uVar58;
                auVar7[0x13] = uVar58;
                auVar7[0x14] = uVar58;
                auVar7[0x15] = uVar58;
                auVar7[0x16] = uVar58;
                auVar7[0x17] = uVar58;
                auVar7[0x18] = uVar58;
                auVar7[0x19] = uVar58;
                auVar7[0x1a] = uVar58;
                auVar7[0x1b] = uVar58;
                auVar7[0x1c] = uVar58;
                auVar7[0x1d] = uVar58;
                auVar7[0x1e] = uVar58;
                auVar7[0x1f] = uVar58;
                auVar6[1] = uVar57;
                auVar6[0] = uVar57;
                auVar6[2] = uVar57;
                auVar6[3] = uVar57;
                auVar6[4] = uVar57;
                auVar6[5] = uVar57;
                auVar6[6] = uVar57;
                auVar6[7] = uVar57;
                auVar6[8] = uVar57;
                auVar6[9] = uVar57;
                auVar6[10] = uVar57;
                auVar6[0xb] = uVar57;
                auVar6[0xc] = uVar57;
                auVar6[0xd] = uVar57;
                auVar6[0xe] = uVar57;
                auVar6[0xf] = uVar57;
                auVar6[0x10] = uVar57;
                auVar6[0x11] = uVar57;
                auVar6[0x12] = uVar57;
                auVar6[0x13] = uVar57;
                auVar6[0x14] = uVar57;
                auVar6[0x15] = uVar57;
                auVar6[0x16] = uVar57;
                auVar6[0x17] = uVar57;
                auVar6[0x18] = uVar57;
                auVar6[0x19] = uVar57;
                auVar6[0x1a] = uVar57;
                auVar6[0x1b] = uVar57;
                auVar6[0x1c] = uVar57;
                auVar6[0x1d] = uVar57;
                auVar6[0x1e] = uVar57;
                auVar6[0x1f] = uVar57;
                iVar8 = (int)size;
                cVar74 = -0x80;
                auVar59[8] = 0x80;
                auVar59._0_8_ = 0x8080808080808080;
                auVar59[9] = 0x80;
                auVar59[10] = 0x80;
                auVar59[0xb] = 0x80;
                auVar59[0xc] = 0x80;
                auVar59[0xd] = 0x80;
                auVar59[0xe] = 0x80;
                auVar59[0xf] = 0x80;
                auVar60[0x10] = 0x80;
                auVar60._0_16_ = auVar59;
                auVar60[0x11] = 0x80;
                auVar60[0x12] = 0x80;
                auVar60[0x13] = 0x80;
                auVar60[0x14] = 0x80;
                auVar60[0x15] = 0x80;
                auVar60[0x16] = 0x80;
                auVar60[0x17] = 0x80;
                auVar60[0x18] = 0x80;
                auVar60[0x19] = 0x80;
                auVar60[0x1a] = 0x80;
                auVar60[0x1b] = 0x80;
                auVar60[0x1c] = 0x80;
                auVar60[0x1d] = 0x80;
                auVar60[0x1e] = 0x80;
                auVar60[0x1f] = 0x80;
                uVar52 = 0;
                auVar65 = ZEXT3264(auVar60);
                auVar63 = ZEXT3264(auVar60);
                do {
                  ptr = b;
                  auVar62 = SUB3216(ptr[iVar8 - 1],0);
                  auVar73._0_16_ = ZEXT116(0) * auVar62 + ZEXT116(1) * auVar59;
                  auVar73._16_16_ = ZEXT116(0) * auVar60._16_16_ + ZEXT116(1) * auVar62;
                  auVar73 = vpalignr_avx2((undefined1  [32])ptr[iVar8 - 1],auVar73,0xf);
                  auVar62 = vpinsrb_avx(auVar73._0_16_,0x80,0);
                  auVar73 = vpblendd_avx2(auVar73,ZEXT1632(auVar62),0xf);
                  iVar53 = ppVar4->mapper[(byte)s2[uVar52]];
                  iVar55 = (int)uVar52 + -2;
                  b = palVar28;
                  if ((int)local_168 == iVar55) {
                    b = local_160;
                  }
                  lVar49 = 0;
                  auVar68 = ZEXT3264(auVar60);
                  do {
                    auVar66 = vpaddsb_avx2(auVar73,*(undefined1 (*) [32])
                                                    ((long)pvVar3 +
                                                    lVar49 + (long)iVar53 * size * 0x20));
                    auVar73 = *(undefined1 (*) [32])((long)*b_00 + lVar49);
                    auVar67 = vpmaxsb_avx2(auVar73,auVar68._0_32_);
                    auVar66 = vpmaxsb_avx2(auVar66,auVar67);
                    *(undefined1 (*) [32])((long)*b + lVar49) = auVar66;
                    auVar67 = vpmaxsb_avx2(auVar66,auVar63._0_32_);
                    auVar63 = ZEXT3264(auVar67);
                    auVar66 = vpsubsb_avx2(auVar66,auVar6);
                    auVar73 = vpsubsb_avx2(auVar73,auVar7);
                    auVar73 = vpmaxsb_avx2(auVar73,auVar66);
                    *(undefined1 (*) [32])((long)*b_00 + lVar49) = auVar73;
                    auVar73 = vpsubsb_avx2(auVar68._0_32_,auVar7);
                    auVar73 = vpmaxsb_avx2(auVar73,auVar66);
                    auVar68 = ZEXT3264(auVar73);
                    auVar73 = *(undefined1 (*) [32])((long)*ptr + lVar49);
                    lVar49 = lVar49 + 0x20;
                  } while (size << 5 != lVar49);
                  if ((int)local_168 == iVar55) {
                    local_160 = palVar28;
                  }
                  iVar53 = 0;
                  do {
                    auVar66._0_16_ = ZEXT116(0) * auVar68._0_16_ + ZEXT116(1) * auVar59;
                    auVar66._16_16_ = ZEXT116(0) * auVar60._16_16_ + ZEXT116(1) * auVar68._0_16_;
                    auVar73 = vpalignr_avx2(auVar68._0_32_,auVar66,0xf);
                    auVar62 = vpinsrb_avx(auVar73._0_16_,0x80,0);
                    auVar73 = vpblendd_avx2(auVar73,ZEXT1632(auVar62),0xf);
                    auVar68 = ZEXT3264(auVar73);
                    lVar49 = 0;
                    do {
                      auVar73 = vpmaxsb_avx2(auVar68._0_32_,
                                             *(undefined1 (*) [32])((long)*b + lVar49));
                      *(undefined1 (*) [32])((long)*b + lVar49) = auVar73;
                      auVar66 = vpmaxsb_avx2(auVar73,auVar63._0_32_);
                      auVar63 = ZEXT3264(auVar66);
                      auVar73 = vpsubsb_avx2(auVar73,auVar6);
                      auVar67 = vpsubsb_avx2(auVar68._0_32_,auVar7);
                      auVar68 = ZEXT3264(auVar67);
                      auVar73 = vpcmpgtb_avx2(auVar67,auVar73);
                      if ((((((((((((((((((((((((((((((((auVar73 >> 7 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0 &&
                                                       (auVar73 >> 0xf & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar73 >> 0x17 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar73 >> 0x1f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar73 >> 0x27 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar73 >> 0x2f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar73 >> 0x37 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar73 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar73 >> 0x47 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar73 >> 0x4f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar73 >> 0x57 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar73 >> 0x5f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar73 >> 0x67 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar73 >> 0x6f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar73 >> 0x77 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar73 >> 0x7f,0) == '\0') &&
                                        (auVar73 >> 0x87 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar73 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar73 >> 0x97 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar73 >> 0x9f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar73 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar73 >> 0xaf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar73 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar73 >> 0xbf,0) == '\0') &&
                                (auVar73 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar73 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar73 >> 0xd7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar73 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar73 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar73 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar73 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          -1 < auVar73[0x1f]) goto LAB_00823753;
                      lVar49 = lVar49 + 0x20;
                    } while (size << 5 != lVar49);
                    iVar53 = iVar53 + 1;
                  } while (iVar53 != 0x20);
LAB_00823753:
                  alVar2 = b[uVar29 % size];
                  cVar69 = alVar2[2]._7_1_;
                  if (uVar26 < 0x1f) {
                    iVar53 = 0;
                    do {
                      auVar73 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,
                                                0x28);
                      alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar73,0xf);
                      cVar69 = alVar2[2]._7_1_;
                      iVar53 = iVar53 + 1;
                    } while (iVar53 < iVar46);
                  }
                  ((result->field_4).rowcols)->score_row[uVar52] = cVar69 + 0x80;
                  auVar73 = vpcmpgtb_avx2(auVar66,auVar65._0_32_);
                  if ((((((((((((((((((((((((((((((((auVar73 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar73 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar73 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar73 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar73 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar73 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar73 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar73 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar73 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar73 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar73 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar73 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar73 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar73 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar73 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar73 >> 0x7f,0) != '\0')
                                    || (auVar73 >> 0x87 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                   (auVar73 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar73 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar73 >> 0x9f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar73 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar73 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar73 >> 0xb7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar73 >> 0xbf,0) != '\0') ||
                            (auVar73 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar73 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar73 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar73 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar73 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar73 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar73 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar73[0x1f] < '\0') {
                    auVar73 = vpermq_avx2(auVar66,0x44);
                    auVar73 = vpmaxsb_avx2(auVar66,auVar73);
                    auVar66 = vpslldq_avx2(auVar73,8);
                    auVar73 = vpmaxsb_avx2(auVar73,auVar66);
                    auVar66 = vpslldq_avx2(auVar73,4);
                    auVar73 = vpmaxsb_avx2(auVar73,auVar66);
                    auVar66 = vpslldq_avx2(auVar73,2);
                    auVar73 = vpmaxsb_avx2(auVar73,auVar66);
                    auVar66 = vpslldq_avx2(auVar73,1);
                    auVar73 = vpmaxsb_avx2(auVar73,auVar66);
                    cVar74 = auVar73[0x17];
                    if ((char)('~' - (char)iVar27) < cVar74) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      local_158 = uVar52;
                      break;
                    }
                    auVar67[8] = 0xf;
                    auVar67._0_8_ = 0xf0f0f0f0f0f0f0f;
                    auVar67[9] = 0xf;
                    auVar67[10] = 0xf;
                    auVar67[0xb] = 0xf;
                    auVar67[0xc] = 0xf;
                    auVar67[0xd] = 0xf;
                    auVar67[0xe] = 0xf;
                    auVar67[0xf] = 0xf;
                    auVar67[0x10] = 0xf;
                    auVar67[0x11] = 0xf;
                    auVar67[0x12] = 0xf;
                    auVar67[0x13] = 0xf;
                    auVar67[0x14] = 0xf;
                    auVar67[0x15] = 0xf;
                    auVar67[0x16] = 0xf;
                    auVar67[0x17] = 0xf;
                    auVar67[0x18] = 0xf;
                    auVar67[0x19] = 0xf;
                    auVar67[0x1a] = 0xf;
                    auVar67[0x1b] = 0xf;
                    auVar67[0x1c] = 0xf;
                    auVar67[0x1d] = 0xf;
                    auVar67[0x1e] = 0xf;
                    auVar67[0x1f] = 0xf;
                    auVar73 = vpshufb_avx2(auVar73,auVar67);
                    auVar73 = vpermq_avx2(auVar73,0xaa);
                    auVar65 = ZEXT3264(auVar73);
                    local_168 = uVar52 & 0xffffffff;
                  }
                  uVar52 = uVar52 + 1;
                  palVar28 = ptr;
                } while (uVar52 != local_158);
                uVar29 = (ulong)(uint)(iVar8 * 4);
                uVar50 = (ulong)(uint)(iVar8 * 8);
                uVar52 = (ulong)(uint)(iVar8 << 4);
                lVar9 = size * 0x1c;
                lVar30 = size * 0x7c;
                lVar31 = size * 0x78;
                lVar32 = size * 0x74;
                lVar33 = size * 0x70;
                lVar34 = size * 0x6c;
                lVar35 = size * 0x68;
                lVar36 = size * 0x20;
                lVar54 = size * 0x40;
                lVar51 = size * 100;
                lVar49 = size * 0x60;
                lVar37 = size * 0x5c;
                lVar38 = size * 0x58;
                lVar39 = size * 0x54;
                lVar40 = size * 0x4c;
                lVar41 = size * 0x3c;
                lVar42 = size * 0x38;
                lVar43 = size * 0x34;
                lVar44 = size * 0x2c;
                lVar45 = 0;
                do {
                  piVar5 = ((result->field_4).rowcols)->score_col;
                  plVar1 = *b + lVar45;
                  lVar24 = *plVar1;
                  cVar69 = *(char *)((long)plVar1 + 1);
                  cVar10 = *(char *)((long)plVar1 + 2);
                  cVar11 = *(char *)((long)plVar1 + 3);
                  cVar12 = *(char *)((long)plVar1 + 4);
                  cVar13 = *(char *)((long)plVar1 + 5);
                  cVar14 = *(char *)((long)plVar1 + 6);
                  cVar15 = *(char *)((long)plVar1 + 7);
                  plVar1 = *b + lVar45 + 2;
                  lVar25 = *plVar1;
                  cVar16 = *(char *)((long)plVar1 + 1);
                  cVar17 = *(char *)((long)plVar1 + 2);
                  cVar18 = *(char *)((long)plVar1 + 3);
                  cVar19 = *(char *)((long)plVar1 + 4);
                  cVar20 = *(char *)((long)plVar1 + 5);
                  cVar21 = *(char *)((long)plVar1 + 6);
                  cVar22 = *(char *)((long)plVar1 + 7);
                  *(int *)((long)piVar5 + lVar45) = (char)lVar24 + 0x80;
                  *(int *)((long)piVar5 + uVar29 + lVar45) = cVar69 + 0x80;
                  *(int *)((long)piVar5 + uVar50 + lVar45) = cVar10 + 0x80;
                  *(int *)((long)piVar5 + uVar29 * 3 + lVar45) = cVar11 + 0x80;
                  *(int *)((long)piVar5 + uVar52 + lVar45) = cVar12 + 0x80;
                  *(int *)((long)piVar5 + uVar29 * 5 + lVar45) = cVar13 + 0x80;
                  *(int *)((long)piVar5 + uVar50 * 3 + lVar45) = cVar14 + 0x80;
                  *(int *)((long)piVar5 + lVar9 + lVar45) = cVar15 + 0x80;
                  *(int *)((long)piVar5 + lVar36 + lVar45) = (char)lVar24 + 0x80;
                  *(int *)((long)piVar5 + uVar29 * 9 + lVar45) = cVar69 + 0x80;
                  *(int *)((long)piVar5 + uVar50 * 5 + lVar45) = cVar10 + 0x80;
                  *(int *)((long)piVar5 + lVar44 + lVar45) = cVar11 + 0x80;
                  *(int *)((long)piVar5 + uVar52 * 3 + lVar45) = cVar12 + 0x80;
                  *(int *)((long)piVar5 + lVar43 + lVar45) = cVar13 + 0x80;
                  *(int *)((long)piVar5 + lVar42 + lVar45) = cVar14 + 0x80;
                  *(int *)((long)piVar5 + lVar41 + lVar45) = cVar15 + 0x80;
                  *(int *)((long)piVar5 + lVar54 + lVar45) = (char)lVar25 + 0x80;
                  *(int *)((long)piVar5 + lVar54 + uVar29 + lVar45) = cVar16 + 0x80;
                  *(int *)((long)piVar5 + uVar50 * 9 + lVar45) = cVar17 + 0x80;
                  *(int *)((long)piVar5 + lVar40 + lVar45) = cVar18 + 0x80;
                  *(int *)((long)piVar5 + uVar52 * 5 + lVar45) = cVar19 + 0x80;
                  *(int *)((long)piVar5 + lVar39 + lVar45) = cVar20 + 0x80;
                  *(int *)((long)piVar5 + lVar38 + lVar45) = cVar21 + 0x80;
                  *(int *)((long)piVar5 + lVar37 + lVar45) = cVar22 + 0x80;
                  *(int *)((long)piVar5 + lVar49 + lVar45) = (char)lVar25 + 0x80;
                  *(int *)((long)piVar5 + lVar51 + lVar45) = cVar16 + 0x80;
                  *(int *)((long)piVar5 + lVar35 + lVar45) = cVar17 + 0x80;
                  *(int *)((long)piVar5 + lVar34 + lVar45) = cVar18 + 0x80;
                  *(int *)((long)piVar5 + lVar33 + lVar45) = cVar19 + 0x80;
                  *(int *)((long)piVar5 + lVar32 + lVar45) = cVar20 + 0x80;
                  *(int *)((long)piVar5 + lVar31 + lVar45) = cVar21 + 0x80;
                  *(int *)((long)piVar5 + lVar30 + lVar45) = cVar22 + 0x80;
                  lVar45 = lVar45 + 4;
                  size = size - 1;
                } while (size != 0);
                if (cVar74 == '\x7f') {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar27 = parasail_result_is_saturated(result);
                palVar28 = local_160;
                if (iVar27 == 0) {
                  palVar23 = ptr;
                  if ((int)local_168 == (int)local_158 + -2) {
                    palVar28 = ptr;
                    palVar23 = local_160;
                  }
                  if ((int)local_168 == (int)local_158 + -1) {
                    palVar28 = b;
                    b = local_160;
                    palVar23 = ptr;
                  }
                  ptr = palVar23;
                  bVar56 = (uVar47 & 0x7fffffe0) == 0;
                  if (!bVar56) {
                    if (bVar56) {
                      uVar29 = 0;
                      do {
                        uVar26 = (uint)(uVar29 >> 5) & 0x7ffffff;
                        if ((int)uVar48 <= (int)uVar26) {
                          uVar26 = uVar48;
                        }
                        if (*(char *)((long)*palVar28 + uVar29) == cVar74) {
                          uVar48 = uVar26;
                        }
                        uVar29 = uVar29 + 1;
                      } while ((int)uVar29 != 0);
                    }
                    else {
                      auVar61._4_4_ = uVar48;
                      auVar61._0_4_ = uVar48;
                      auVar61._8_4_ = uVar48;
                      auVar61._12_4_ = uVar48;
                      auVar61._16_4_ = uVar48;
                      auVar61._20_4_ = uVar48;
                      auVar61._24_4_ = uVar48;
                      auVar61._28_4_ = uVar48;
                      auVar62[1] = cVar74;
                      auVar62[0] = cVar74;
                      auVar62[2] = cVar74;
                      auVar62[3] = cVar74;
                      auVar62[4] = cVar74;
                      auVar62[5] = cVar74;
                      auVar62[6] = cVar74;
                      auVar62[7] = cVar74;
                      auVar62[8] = cVar74;
                      auVar62[9] = cVar74;
                      auVar62[10] = cVar74;
                      auVar62[0xb] = cVar74;
                      auVar62[0xc] = cVar74;
                      auVar62[0xd] = cVar74;
                      auVar62[0xe] = cVar74;
                      auVar62[0xf] = cVar74;
                      auVar64._4_4_ = iVar8;
                      auVar64._0_4_ = iVar8;
                      auVar64._8_4_ = iVar8;
                      auVar64._12_4_ = iVar8;
                      auVar64._16_4_ = iVar8;
                      auVar64._20_4_ = iVar8;
                      auVar64._24_4_ = iVar8;
                      auVar64._28_4_ = iVar8;
                      auVar7 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
                      uVar29 = 0;
                      auVar70._8_4_ = 0x1f;
                      auVar70._0_8_ = 0x1f0000001f;
                      auVar70._12_4_ = 0x1f;
                      auVar70._16_4_ = 0x1f;
                      auVar70._20_4_ = 0x1f;
                      auVar70._24_4_ = 0x1f;
                      auVar70._28_4_ = 0x1f;
                      auVar71._8_4_ = 8;
                      auVar71._0_8_ = 0x800000008;
                      auVar71._12_4_ = 8;
                      auVar71._16_4_ = 8;
                      auVar71._20_4_ = 8;
                      auVar71._24_4_ = 8;
                      auVar71._28_4_ = 8;
                      do {
                        auVar72._8_8_ = 0;
                        auVar72._0_8_ = *(ulong *)((long)*palVar28 + uVar29);
                        auVar59 = vpcmpeqb_avx(auVar72,auVar62);
                        auVar60 = vpmovsxbd_avx2(auVar59);
                        auVar73 = vpsrld_avx2(auVar7,5);
                        auVar6 = vpand_avx2(auVar7,auVar70);
                        auVar6 = vpmulld_avx2(auVar6,auVar64);
                        auVar6 = vpaddd_avx2(auVar6,auVar73);
                        auVar6 = vpminsd_avx2(auVar6,auVar61);
                        auVar61 = vblendvps_avx(auVar61,auVar6,auVar60);
                        uVar29 = uVar29 + 8;
                        auVar7 = vpaddd_avx2(auVar7,auVar71);
                      } while (a != uVar29);
                      auVar59 = vpminsd_avx(auVar61._0_16_,auVar61._16_16_);
                      auVar62 = vpshufd_avx(auVar59,0xee);
                      auVar59 = vpminsd_avx(auVar59,auVar62);
                      auVar62 = vpshufd_avx(auVar59,0x55);
                      auVar59 = vpminsd_avx(auVar59,auVar62);
                      uVar48 = auVar59._0_4_;
                    }
                  }
                  iVar27 = cVar74 + 0x80;
                }
                else {
                  local_168._0_4_ = 0;
                  iVar27 = 0xff;
                  uVar48 = 0;
                }
                result->score = iVar27;
                result->end_query = uVar48;
                result->end_ref = (int)local_168;
                parasail_free(b_00);
                parasail_free(palVar28);
                parasail_free(ptr);
                parasail_free(b);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int8_t bias = 0;
    int8_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int8_t maxp = 0;
    __m256i insert_mask;
    /*int8_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    vZero = _mm256_set1_epi8(0);
    bias = INT8_MIN;
    score = bias;
    vBias = _mm256_set1_epi8(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT8_MAX - (int8_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi8(
            _mm256_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT8_MAX : (int8_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi8(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi8(vH, vMaxH);
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi8(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT8_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}